

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc.cpp
# Opt level: O0

ifstream * getLastLine_abi_cxx11_(ifstream *in)

{
  bool bVar1;
  long *plVar2;
  istream *piVar3;
  ifstream *in_RSI;
  undefined1 auVar4 [16];
  bool local_71;
  undefined1 local_38 [8];
  pos_type lastPos;
  pos_type pos;
  ifstream *in_local;
  string *line;
  
  auVar4 = std::istream::tellg();
  pos._M_off = auVar4._8_8_;
  lastPos._M_state = auVar4._0_8_;
  std::fpos<__mbstate_t>::fpos((fpos<__mbstate_t> *)local_38);
  while( true ) {
    plVar2 = (long *)std::istream::operator>>(in_RSI,std::ws<char,std::char_traits<char>>);
    bVar1 = std::ios::operator_cast_to_bool((ios *)((long)plVar2 + *(long *)(*plVar2 + -0x18)));
    local_71 = false;
    if (bVar1) {
      piVar3 = ignoreline(in_RSI,(pos_type *)local_38);
      local_71 = std::ios::operator_cast_to_bool
                           ((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
    }
    if (local_71 == false) break;
    lastPos._M_state.__count = local_38._0_4_;
    lastPos._M_state.__value = (anon_union_4_2_91654ee9_for___value)local_38._4_4_;
    pos._M_off = lastPos._M_off;
  }
  std::ios::clear(in_RSI + *(long *)(*(long *)in_RSI + -0x18),0);
  std::istream::seekg(in_RSI,lastPos._M_state,pos._M_off);
  std::__cxx11::string::string((string *)in);
  std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)in_RSI,(string *)in);
  return in;
}

Assistant:

std::string getLastLine(std::ifstream& in)
{
    std::ifstream::pos_type pos = in.tellg();

    std::ifstream::pos_type lastPos;
    while (in >> std::ws && ignoreline(in, lastPos))
        pos = lastPos;

    in.clear();
    in.seekg(pos);

    std::string line;
    std::getline(in, line);
    return line;
}